

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool IsBadPort(uint16_t port)

{
  bool bVar1;
  uint uVar2;
  undefined2 in_register_0000003a;
  long in_FS_OFFSET;
  
  bVar1 = true;
  if (((((0x35 < CONCAT22(in_register_0000003a,port)) ||
        ((0x200c2002faaa82U >> ((ulong)CONCAT22(in_register_0000003a,port) & 0x3f) & 1) == 0)) &&
       ((uVar2 = CONCAT22(in_register_0000003a,port) - 0x45, 0x36 < uVar2 ||
        ((0x45570f04040501U >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) &&
      ((((uVar2 = CONCAT22(in_register_0000003a,port) - 0x200, 0x33 < uVar2 ||
         ((0x81410101c400fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
        ((uVar2 = CONCAT22(in_register_0000003a,port) - 0x87, 0x2c < uVar2 ||
         ((0x100004000115U >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) &&
       ((((uVar2 = CONCAT22(in_register_0000003a,port) - 0x1a09, 0x20 < uVar2 ||
          ((0x10000001fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
         ((uVar2 = CONCAT22(in_register_0000003a,port) - 0x3dd, 6 < uVar2 ||
          ((0x53U >> (uVar2 & 0x1f) & 1) == 0)))) &&
        ((uVar2 = CONCAT22(in_register_0000003a,port) - 0x24b, 0x31 < uVar2 ||
         ((0x2000000004001U >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))))) &&
     (((uVar2 = CONCAT22(in_register_0000003a,port) - 0x6b7, 4 < uVar2 ||
       ((0x13U >> (uVar2 & 0x1f) & 1) == 0)) &&
      ((((((1 < CONCAT22(in_register_0000003a,port) - 0x13c4U &&
           (CONCAT22(in_register_0000003a,port) != 0x185)) &&
          (CONCAT22(in_register_0000003a,port) != 0x1ab)) &&
         ((CONCAT22(in_register_0000003a,port) != 0x1d1 &&
          (CONCAT22(in_register_0000003a,port) != 0x801)))) &&
        ((CONCAT22(in_register_0000003a,port) != 0xe4b &&
         ((CONCAT22(in_register_0000003a,port) != 0xfcd &&
          (CONCAT22(in_register_0000003a,port) != 6000)))))) &&
       ((CONCAT22(in_register_0000003a,port) != 0x19a6 &&
        (CONCAT22(in_register_0000003a,port) != 0x2760)))))))) {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool IsBadPort(uint16_t port)
{
    /* Don't forget to update doc/p2p-bad-ports.md if you change this list. */

    switch (port) {
    case 1:     // tcpmux
    case 7:     // echo
    case 9:     // discard
    case 11:    // systat
    case 13:    // daytime
    case 15:    // netstat
    case 17:    // qotd
    case 19:    // chargen
    case 20:    // ftp data
    case 21:    // ftp access
    case 22:    // ssh
    case 23:    // telnet
    case 25:    // smtp
    case 37:    // time
    case 42:    // name
    case 43:    // nicname
    case 53:    // domain
    case 69:    // tftp
    case 77:    // priv-rjs
    case 79:    // finger
    case 87:    // ttylink
    case 95:    // supdup
    case 101:   // hostname
    case 102:   // iso-tsap
    case 103:   // gppitnp
    case 104:   // acr-nema
    case 109:   // pop2
    case 110:   // pop3
    case 111:   // sunrpc
    case 113:   // auth
    case 115:   // sftp
    case 117:   // uucp-path
    case 119:   // nntp
    case 123:   // NTP
    case 135:   // loc-srv /epmap
    case 137:   // netbios
    case 139:   // netbios
    case 143:   // imap2
    case 161:   // snmp
    case 179:   // BGP
    case 389:   // ldap
    case 427:   // SLP (Also used by Apple Filing Protocol)
    case 465:   // smtp+ssl
    case 512:   // print / exec
    case 513:   // login
    case 514:   // shell
    case 515:   // printer
    case 526:   // tempo
    case 530:   // courier
    case 531:   // chat
    case 532:   // netnews
    case 540:   // uucp
    case 548:   // AFP (Apple Filing Protocol)
    case 554:   // rtsp
    case 556:   // remotefs
    case 563:   // nntp+ssl
    case 587:   // smtp (rfc6409)
    case 601:   // syslog-conn (rfc3195)
    case 636:   // ldap+ssl
    case 989:   // ftps-data
    case 990:   // ftps
    case 993:   // ldap+ssl
    case 995:   // pop3+ssl
    case 1719:  // h323gatestat
    case 1720:  // h323hostcall
    case 1723:  // pptp
    case 2049:  // nfs
    case 3659:  // apple-sasl / PasswordServer
    case 4045:  // lockd
    case 5060:  // sip
    case 5061:  // sips
    case 6000:  // X11
    case 6566:  // sane-port
    case 6665:  // Alternate IRC
    case 6666:  // Alternate IRC
    case 6667:  // Standard IRC
    case 6668:  // Alternate IRC
    case 6669:  // Alternate IRC
    case 6697:  // IRC + TLS
    case 10080: // Amanda
        return true;
    }
    return false;
}